

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarReader.cpp
# Opt level: O0

Barcode * __thiscall
ZXing::OneD::DataBarReader::decodePattern
          (DataBarReader *this,int rowNumber,PatternView *next,
          unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
          *state)

{
  Pair leftPair_00;
  Pair rightPair_00;
  Pair rightPair_01;
  bool bVar1;
  PatternView *in_RCX;
  int in_EDX;
  Barcode *in_RDI;
  pair<std::__detail::_Node_iterator<ZXing::OneD::DataBar::Pair,_true,_false>,_bool> pVar2;
  Pair *rightPair_1;
  iterator __end3;
  iterator __begin3;
  unordered_set<ZXing::OneD::DataBar::Pair,_ZXing::OneD::DataBar::PairHash,_std::equal_to<ZXing::OneD::DataBar::Pair>,_std::allocator<ZXing::OneD::DataBar::Pair>_>
  *__range3;
  Pair *leftPair_1;
  iterator __end2;
  iterator __begin2;
  unordered_set<ZXing::OneD::DataBar::Pair,_ZXing::OneD::DataBar::PairHash,_std::equal_to<ZXing::OneD::DataBar::Pair>,_std::allocator<ZXing::OneD::DataBar::Pair>_>
  *__range2;
  Pair rightPair;
  Pair leftPair;
  State *prevState;
  Barcode *res;
  unordered_set<ZXing::OneD::DataBar::Pair,_ZXing::OneD::DataBar::PairHash,_std::equal_to<ZXing::OneD::DataBar::Pair>,_std::allocator<ZXing::OneD::DataBar::Pair>_>
  *in_stack_fffffffffffffbb8;
  Character bytes;
  State *in_stack_fffffffffffffbc0;
  Character this_00;
  value_type *in_stack_fffffffffffffbc8;
  Content *this_01;
  unordered_set<ZXing::OneD::DataBar::Pair,_ZXing::OneD::DataBar::PairHash,_std::equal_to<ZXing::OneD::DataBar::Pair>,_std::allocator<ZXing::OneD::DataBar::Pair>_>
  *in_stack_fffffffffffffbd0;
  DetectorResult *this_02;
  int in_stack_fffffffffffffbd8;
  int in_stack_fffffffffffffbdc;
  PatternView *in_stack_fffffffffffffbe0;
  Character last;
  Pair *first;
  undefined4 in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc04;
  PatternView *in_stack_fffffffffffffc10;
  undefined7 local_3b8;
  undefined1 in_stack_fffffffffffffc4f;
  PatternView *in_stack_fffffffffffffc50;
  Iterator local_3a8;
  Iterator in_stack_fffffffffffffc60;
  undefined1 in_stack_fffffffffffffc68 [20];
  BarcodeFormat in_stack_fffffffffffffc7c;
  int in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc84;
  undefined8 in_stack_fffffffffffffc88;
  DecoderResult *decodeResult;
  undefined8 in_stack_fffffffffffffc90;
  Result *this_03;
  undefined8 in_stack_fffffffffffffc98;
  undefined8 in_stack_fffffffffffffca0;
  int in_stack_fffffffffffffca8;
  Pair in_stack_fffffffffffffcb0;
  undefined1 in_stack_fffffffffffffcd8 [28];
  int in_stack_fffffffffffffcf4;
  undefined1 in_stack_fffffffffffffcf8;
  undefined1 in_stack_fffffffffffffcf9;
  undefined1 in_stack_fffffffffffffcfa;
  undefined1 in_stack_fffffffffffffcfb;
  string local_298 [112];
  DecoderResult local_228;
  undefined1 local_151;
  undefined1 local_150 [32];
  undefined4 local_130;
  unordered_set<ZXing::OneD::DataBar::Pair,_ZXing::OneD::DataBar::PairHash,_std::equal_to<ZXing::OneD::DataBar::Pair>,_std::allocator<ZXing::OneD::DataBar::Pair>_>
  *local_128;
  State *pSStack_120;
  reference local_100;
  _Node_iterator_base<ZXing::OneD::DataBar::Pair,_false> local_f8;
  _Node_iterator_base<ZXing::OneD::DataBar::Pair,_false> local_f0;
  pointer local_e8;
  reference local_e0;
  _Node_iterator_base<ZXing::OneD::DataBar::Pair,_false> local_d8;
  _Node_iterator_base<ZXing::OneD::DataBar::Pair,_false> local_d0;
  pointer local_c8;
  _Node_iterator_base<ZXing::OneD::DataBar::Pair,_false> local_c0;
  undefined1 local_b8;
  Pair local_ac;
  _Node_iterator_base<ZXing::OneD::DataBar::Pair,_false> local_88;
  undefined1 local_80;
  Pair local_74;
  Iterator local_50;
  undefined8 local_48;
  Iterator local_40;
  Iterator local_38;
  pointer local_30;
  PatternView *local_20;
  int local_14;
  
  local_20 = in_RCX;
  local_14 = in_EDX;
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
                      *)0x28f7ae);
  if (!bVar1) {
    operator_new(0x78);
    State::State(in_stack_fffffffffffffbc0);
    std::
    unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
    ::reset((unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
             *)in_stack_fffffffffffffbc0,(pointer)in_stack_fffffffffffffbb8);
  }
  local_30 = std::
             unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
             ::get((unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
                    *)in_stack_fffffffffffffbc0);
  PatternView::subView
            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8);
  local_20->_data = local_50;
  *(undefined8 *)&local_20->_size = local_48;
  local_20->_base = local_40;
  local_20->_end = local_38;
  while (bVar1 = PatternView::shift(local_20,1), bVar1) {
    bVar1 = IsLeftPair(in_stack_fffffffffffffc10);
    if (bVar1) {
      ReadPair(in_stack_fffffffffffffc50,(bool)in_stack_fffffffffffffc4f);
      bVar1 = DataBar::Pair::operator_cast_to_bool(&local_74);
      if (bVar1) {
        local_74.y = local_14;
        pVar2 = std::
                unordered_set<ZXing::OneD::DataBar::Pair,_ZXing::OneD::DataBar::PairHash,_std::equal_to<ZXing::OneD::DataBar::Pair>,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                ::insert(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
        local_88._M_cur =
             (__node_type *)
             pVar2.first.super__Node_iterator_base<ZXing::OneD::DataBar::Pair,_false>._M_cur;
        local_80 = pVar2.second;
        PatternView::shift(local_20,0x14);
      }
    }
    bVar1 = PatternView::shift(local_20,1);
    if ((bVar1) && (bVar1 = IsRightPair(in_stack_fffffffffffffc10), bVar1)) {
      ReadPair(in_stack_fffffffffffffc50,(bool)in_stack_fffffffffffffc4f);
      bVar1 = DataBar::Pair::operator_cast_to_bool(&local_ac);
      if (bVar1) {
        local_ac.y = local_14;
        pVar2 = std::
                unordered_set<ZXing::OneD::DataBar::Pair,_ZXing::OneD::DataBar::PairHash,_std::equal_to<ZXing::OneD::DataBar::Pair>,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                ::insert(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
        local_c0._M_cur =
             (__node_type *)
             pVar2.first.super__Node_iterator_base<ZXing::OneD::DataBar::Pair,_false>._M_cur;
        local_b8 = pVar2.second;
        PatternView::shift(local_20,0x17);
      }
    }
  }
  local_c8 = local_30 + 1;
  local_d0._M_cur =
       (__node_type *)
       std::
       unordered_set<ZXing::OneD::DataBar::Pair,_ZXing::OneD::DataBar::PairHash,_std::equal_to<ZXing::OneD::DataBar::Pair>,_std::allocator<ZXing::OneD::DataBar::Pair>_>
       ::begin(in_stack_fffffffffffffbb8);
  local_d8._M_cur =
       (__node_type *)
       std::
       unordered_set<ZXing::OneD::DataBar::Pair,_ZXing::OneD::DataBar::PairHash,_std::equal_to<ZXing::OneD::DataBar::Pair>,_std::allocator<ZXing::OneD::DataBar::Pair>_>
       ::end(in_stack_fffffffffffffbb8);
  do {
    bVar1 = std::__detail::operator!=(&local_d0,&local_d8);
    if (!bVar1) {
      memset(&local_3b8,0,0x20);
      PatternView::PatternView((PatternView *)&local_3b8);
      local_20->_data = (Iterator)CONCAT17(in_stack_fffffffffffffc4f,local_3b8);
      *(PatternView **)&local_20->_size = in_stack_fffffffffffffc50;
      local_20->_base = local_3a8;
      local_20->_end = in_stack_fffffffffffffc60;
      memset(in_RDI,0,0xd8);
      Result::Result((Result *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
      return in_RDI;
    }
    local_e0 = std::__detail::_Node_iterator<ZXing::OneD::DataBar::Pair,_true,_false>::operator*
                         ((_Node_iterator<ZXing::OneD::DataBar::Pair,_true,_false> *)0x28fa02);
    local_e8 = local_30 + 8;
    local_f0._M_cur =
         (__node_type *)
         std::
         unordered_set<ZXing::OneD::DataBar::Pair,_ZXing::OneD::DataBar::PairHash,_std::equal_to<ZXing::OneD::DataBar::Pair>,_std::allocator<ZXing::OneD::DataBar::Pair>_>
         ::begin(in_stack_fffffffffffffbb8);
    local_f8._M_cur =
         (__node_type *)
         std::
         unordered_set<ZXing::OneD::DataBar::Pair,_ZXing::OneD::DataBar::PairHash,_std::equal_to<ZXing::OneD::DataBar::Pair>,_std::allocator<ZXing::OneD::DataBar::Pair>_>
         ::end(in_stack_fffffffffffffbb8);
    while (bVar1 = std::__detail::operator!=(&local_f0,&local_f8), bVar1) {
      local_100 = std::__detail::_Node_iterator<ZXing::OneD::DataBar::Pair,_true,_false>::operator*
                            ((_Node_iterator<ZXing::OneD::DataBar::Pair,_true,_false> *)0x28fa73);
      memcpy(&local_128,local_e0,0x24);
      memcpy(local_150,local_100,0x24);
      leftPair_00.right.value = (int)in_stack_fffffffffffffc68._0_8_;
      leftPair_00.right.checksum = (int)((ulong)in_stack_fffffffffffffc68._0_8_ >> 0x20);
      leftPair_00.finder = in_stack_fffffffffffffc68._8_4_;
      leftPair_00.xStart = in_stack_fffffffffffffc68._12_4_;
      leftPair_00.xStop = in_stack_fffffffffffffc68._16_4_;
      leftPair_00.left = (Character)in_stack_fffffffffffffc60;
      leftPair_00.y = in_stack_fffffffffffffc7c;
      leftPair_00.count = in_stack_fffffffffffffc80;
      rightPair_00.right.value = (int)in_stack_fffffffffffffc90;
      rightPair_00.right.checksum = (int)((ulong)in_stack_fffffffffffffc90 >> 0x20);
      rightPair_00.left.value = (int)in_stack_fffffffffffffc88;
      rightPair_00.left.checksum = (int)((ulong)in_stack_fffffffffffffc88 >> 0x20);
      rightPair_00.finder = (int)in_stack_fffffffffffffc98;
      rightPair_00.xStart = (int)((ulong)in_stack_fffffffffffffc98 >> 0x20);
      rightPair_00.xStop = (int)in_stack_fffffffffffffca0;
      rightPair_00.y = (int)((ulong)in_stack_fffffffffffffca0 >> 0x20);
      rightPair_00.count = in_stack_fffffffffffffca8;
      in_stack_fffffffffffffbb8 = local_128;
      in_stack_fffffffffffffbc0 = pSStack_120;
      in_stack_fffffffffffffc00 = local_130;
      bVar1 = ChecksumIsValid(leftPair_00,rightPair_00);
      if (bVar1) {
        local_151 = 0;
        bytes = local_e0->left;
        this_00 = local_e0->right;
        this_01 = *(Content **)&local_e0->finder;
        this_02 = *(DetectorResult **)&local_e0->xStop;
        last = local_100->right;
        first = *(Pair **)&local_100->finder;
        rightPair_01.y = in_stack_fffffffffffffcf4;
        rightPair_01.left.value = (int)in_stack_fffffffffffffcd8._0_8_;
        rightPair_01.left.checksum = (int)((ulong)in_stack_fffffffffffffcd8._0_8_ >> 0x20);
        rightPair_01.right.value = (int)in_stack_fffffffffffffcd8._8_8_;
        rightPair_01.right.checksum = (int)((ulong)in_stack_fffffffffffffcd8._8_8_ >> 0x20);
        rightPair_01.finder = in_stack_fffffffffffffcd8._16_4_;
        rightPair_01.xStart = in_stack_fffffffffffffcd8._20_4_;
        rightPair_01.xStop = in_stack_fffffffffffffcd8._24_4_;
        rightPair_01.count._0_1_ = in_stack_fffffffffffffcf8;
        rightPair_01.count._1_1_ = in_stack_fffffffffffffcf9;
        rightPair_01.count._2_1_ = in_stack_fffffffffffffcfa;
        rightPair_01.count._3_1_ = in_stack_fffffffffffffcfb;
        ConstructText_abi_cxx11_(in_stack_fffffffffffffcb0,rightPair_01);
        ByteArray::ByteArray((ByteArray *)first,(string *)last);
        Content::Content(this_01,(ByteArray *)this_00,SUB84((ulong)this_02 >> 0x20,0));
        DecoderResult::DecoderResult((DecoderResult *)this_00,(Content *)bytes);
        DataBar::EstimateLineCount((Pair *)this_00,(Pair *)bytes);
        DecoderResult::setLineCount(&local_228,(int *)&stack0xfffffffffffffcf4);
        decodeResult = (DecoderResult *)0x0;
        this_03 = (Result *)0x0;
        BitMatrix::BitMatrix((BitMatrix *)0x28fc80);
        DataBar::EstimatePosition(first,(Pair *)last);
        DetectorResult::DetectorResult(this_02,(BitMatrix *)this_01,(QuadrilateralI *)this_00);
        Result::Result(this_03,decodeResult,
                       (DetectorResult *)
                       CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80),
                       in_stack_fffffffffffffc7c);
        DetectorResult::~DetectorResult((DetectorResult *)0x28fcec);
        BitMatrix::~BitMatrix((BitMatrix *)0x28fcf9);
        DecoderResult::~DecoderResult((DecoderResult *)this_00);
        Content::~Content((Content *)this_00);
        ByteArray::~ByteArray((ByteArray *)0x28fd20);
        std::__cxx11::string::~string(local_298);
        std::
        unordered_set<ZXing::OneD::DataBar::Pair,_ZXing::OneD::DataBar::PairHash,_std::equal_to<ZXing::OneD::DataBar::Pair>,_std::allocator<ZXing::OneD::DataBar::Pair>_>
        ::erase((unordered_set<ZXing::OneD::DataBar::Pair,_ZXing::OneD::DataBar::PairHash,_std::equal_to<ZXing::OneD::DataBar::Pair>,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                 *)this_00,(key_type *)bytes);
        std::
        unordered_set<ZXing::OneD::DataBar::Pair,_ZXing::OneD::DataBar::PairHash,_std::equal_to<ZXing::OneD::DataBar::Pair>,_std::allocator<ZXing::OneD::DataBar::Pair>_>
        ::erase((unordered_set<ZXing::OneD::DataBar::Pair,_ZXing::OneD::DataBar::PairHash,_std::equal_to<ZXing::OneD::DataBar::Pair>,_std::allocator<ZXing::OneD::DataBar::Pair>_>
                 *)this_00,(key_type *)bytes);
        return in_RDI;
      }
      std::__detail::_Node_iterator<ZXing::OneD::DataBar::Pair,_true,_false>::operator++
                ((_Node_iterator<ZXing::OneD::DataBar::Pair,_true,_false> *)
                 in_stack_fffffffffffffbc0);
    }
    std::__detail::_Node_iterator<ZXing::OneD::DataBar::Pair,_true,_false>::operator++
              ((_Node_iterator<ZXing::OneD::DataBar::Pair,_true,_false> *)in_stack_fffffffffffffbc0)
    ;
  } while( true );
}

Assistant:

Barcode DataBarReader::decodePattern(int rowNumber, PatternView& next, std::unique_ptr<RowReader::DecodingState>& state) const
{
#if 0 // non-stacked version
	next = next.subView(-1, FULL_PAIR_SIZE + 1); // +1 reflects the guard pattern on the right, see IsRightPair());
	// yes: the first view we test is at index 1 (black bar at 0 would be the guard pattern)
	while (next.shift(2)) {
		if (IsLeftPair(next)) {
			if (auto leftPair = ReadPair(next, false); leftPair && next.shift(FULL_PAIR_SIZE) && IsRightPair(next)) {
				if (auto rightPair = ReadPair(next, true); rightPair && ChecksumIsValid(leftPair, rightPair)) {
					return {ConstructText(leftPair, rightPair), rowNumber, leftPair.xStart, rightPair.xStop,
							BarcodeFormat::DataBar};
				}
			}
		}
	}
#else
	if (!state)
		state.reset(new State);
	auto* prevState = static_cast<State*>(state.get());

	next = next.subView(0, FULL_PAIR_SIZE + 1); // +1 reflects the guard pattern on the right, see IsRightPair()
	// yes: the first view we test is at index 1 (black bar at 0 would be the guard pattern)
	while (next.shift(1)) {
		if (IsLeftPair(next)) {
			if (auto leftPair = ReadPair(next, false)) {
				leftPair.y = rowNumber;
				prevState->leftPairs.insert(leftPair);
				next.shift(FULL_PAIR_SIZE - 1);
			}
		}

		if (next.shift(1) && IsRightPair(next)) {
			if (auto rightPair = ReadPair(next, true)) {
				rightPair.y = rowNumber;
				prevState->rightPairs.insert(rightPair);
				next.shift(FULL_PAIR_SIZE + 2);
			}
		}
	}

	for (const auto& leftPair : prevState->leftPairs)
		for (const auto& rightPair : prevState->rightPairs)
			if (ChecksumIsValid(leftPair, rightPair)) {
				// Symbology identifier ISO/IEC 24724:2011 Section 9 and GS1 General Specifications 5.1.3 Figure 5.1.3-2
				Barcode res{DecoderResult(Content(ByteArray(ConstructText(leftPair, rightPair)), {'e', '0'}))
								.setLineCount(EstimateLineCount(leftPair, rightPair)),
							{{}, EstimatePosition(leftPair, rightPair)},
							BarcodeFormat::DataBar};

				prevState->leftPairs.erase(leftPair);
				prevState->rightPairs.erase(rightPair);
				return res;
			}
#endif

	// guarantee progress (see loop in ODReader.cpp)
	next = {};

	return {};
}